

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

int av1_get_cb_rdmult(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  byte bVar1;
  aom_enc_pass aVar2;
  AV1_PRIMARY *pAVar3;
  TplDepFrame *pTVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int col;
  int iVar17;
  uint is_stat_consumption_stage;
  int iVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  bVar1 = cpi->gf_frame_index;
  pAVar3 = cpi->ppi;
  iVar11 = (pAVar3->p_rc).gfu_boost;
  iVar12 = (pAVar3->gf_group).layer_depth[bVar1];
  aVar2 = (cpi->oxcf).pass;
  is_stat_consumption_stage = 1;
  if (((aVar2 < AOM_RC_LAST_PASS) && (is_stat_consumption_stage = 0, aVar2 == AOM_RC_ONE_PASS)) &&
     (cpi->compressor_stage == '\0')) {
    is_stat_consumption_stage = (uint)(pAVar3->lap_enabled != 0);
  }
  iVar17 = 6;
  if (iVar12 < 6) {
    iVar17 = iVar12;
  }
  iVar12 = 0xf;
  if (iVar11 < 0x640) {
    iVar12 = iVar11 / 100;
  }
  iVar11 = av1_compute_rd_mult((cpi->common).quant_params.base_qindex + x->rdmult_delta_qindex +
                               (cpi->common).quant_params.y_dc_delta_q,
                               ((cpi->common).seq_params)->bit_depth,
                               (pAVar3->gf_group).update_type[bVar1],iVar17,iVar12,
                               (cpi->common).current_frame.frame_type,
                               (cpi->oxcf).q_cfg.use_fixed_qp_offsets,is_stat_consumption_stage,
                               (cpi->oxcf).tune_cfg.tuning);
  iVar12 = av1_tpl_stats_ready(&cpi->ppi->tpl_data,(uint)bVar1);
  if (((iVar12 != 0) && ((cpi->common).superres_scale_denominator == '\b')) &&
     ((cpi->oxcf).q_cfg.aq_mode == '\0')) {
    dVar19 = 0.0;
    if ((x->rb != 0.0) || (NAN(x->rb))) {
      pAVar3 = cpi->ppi;
      pTVar4 = (pAVar3->tpl_data).tpl_frame;
      uVar16 = (ulong)(((uint)bVar1 * 2 + (uint)bVar1) * 0x20);
      lVar5 = *(long *)((long)pTVar4->ref_map_index + (uVar16 - 0x18));
      iVar18 = 1 << ((pAVar3->tpl_data).tpl_stats_block_mis_log2 & 0x1f);
      iVar12 = *(int *)((long)pTVar4->ref_map_index + uVar16 + 0x20);
      iVar15 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bsize] + mi_row;
      bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
      dVar20 = 0.0;
      dVar21 = 0.0;
      iVar17 = mi_col;
      do {
        if ((mi_row < (cpi->common).mi_params.mi_rows) && (iVar17 < (cpi->common).mi_params.mi_cols)
           ) {
          iVar13 = av1_tpl_ptr_pos(mi_row,iVar17,iVar12,(pAVar3->tpl_data).tpl_stats_block_mis_log2)
          ;
          lVar14 = (long)iVar13 * 200;
          dVar8 = (double)*(long *)(lVar5 + 8 + lVar14);
          iVar13 = *(int *)((long)pTVar4->ref_map_index + uVar16 + 0x34);
          lVar6 = *(long *)(lVar5 + 0x40 + lVar14);
          lVar7 = *(long *)(lVar5 + 0x48 + lVar14);
          dVar9 = (double)(*(long *)(lVar5 + 0x18 + lVar14) << 7);
          dVar10 = log(dVar9);
          dVar9 = log(dVar9 * 3.0 + (double)(lVar7 * 0x80 + (iVar13 * lVar6 + 0x100 >> 9)));
          dVar19 = dVar19 + dVar8;
          dVar20 = dVar20 + dVar8 * dVar9;
          dVar21 = dVar21 + dVar8 * dVar10;
        }
        iVar17 = iVar17 + iVar18;
      } while ((iVar17 < (int)((uint)bVar1 + mi_col)) ||
              (mi_row = mi_row + iVar18, iVar17 = mi_col, mi_row < iVar15));
      if ((dVar19 != 0.0) || (NAN(dVar19))) {
        dVar19 = exp((dVar21 - dVar20) / dVar19);
        iVar12 = (int)((dVar19 / x->rb) * (double)iVar11);
        iVar11 = 1;
        if (1 < iVar12) {
          iVar11 = iVar12;
        }
      }
    }
  }
  return iVar11;
}

Assistant:

int av1_get_cb_rdmult(const AV1_COMP *const cpi, MACROBLOCK *const x,
                      const BLOCK_SIZE bsize, const int mi_row,
                      const int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;
  int deltaq_rdmult = set_rdmult(cpi, x, -1);
  if (!av1_tpl_stats_ready(&cpi->ppi->tpl_data, tpl_idx)) return deltaq_rdmult;
  if (cm->superres_scale_denominator != SCALE_NUMERATOR) return deltaq_rdmult;
  if (cpi->oxcf.q_cfg.aq_mode != NO_AQ) return deltaq_rdmult;
  if (x->rb == 0) return deltaq_rdmult;

  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;

  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  int tpl_stride = tpl_frame->stride;
  double intra_cost_base = 0;
  double mc_dep_cost_base = 0;
  double cbcmp_base = 0;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  for (int row = mi_row; row < mi_row + mi_high; row += step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];

      double cbcmp = (double)this_stats->srcrf_dist;
      int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
      intra_cost_base += log(dist_scaled) * cbcmp;
      mc_dep_cost_base += log(3 * dist_scaled + mc_dep_delta) * cbcmp;
      cbcmp_base += cbcmp;
    }
  }

  if (cbcmp_base == 0) return deltaq_rdmult;

  double rk = exp((intra_cost_base - mc_dep_cost_base) / cbcmp_base);
  deltaq_rdmult = (int)(deltaq_rdmult * (rk / x->rb));

  return AOMMAX(deltaq_rdmult, 1);
}